

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [12];
  timediff_t tVar4;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  timediff_t comp;
  Curl_tree *y;
  Curl_tree *r;
  Curl_tree *l;
  Curl_tree N;
  Curl_tree *t_local;
  curltime i_local;
  
  if (t == (Curl_tree *)0x0) {
    i_local.tv_usec = 0;
    i_local._12_4_ = 0;
  }
  else {
    N.smaller = (Curl_tree *)0x0;
    l = (Curl_tree *)0x0;
    y = (Curl_tree *)&l;
    r = (Curl_tree *)&l;
    N.ptr = t;
    while( true ) {
      while( true ) {
        auVar3 = i._0_12_;
        newer._12_4_ = 0;
        newer.tv_sec = auVar3._0_8_;
        newer.tv_usec = auVar3._8_4_;
        older._12_4_ = 0;
        older._0_12_ = *(undefined1 (*) [12])((long)N.ptr + 0x20);
        tVar4 = Curl_timediff_us(newer,older);
        if (tVar4 < 0) break;
        if ((tVar4 < 1) || (*(long *)((long)N.ptr + 8) == 0)) goto LAB_0018fa15;
        newer_01._12_4_ = 0;
        newer_01.tv_sec = auVar3._0_8_;
        newer_01.tv_usec = auVar3._8_4_;
        older_01._12_4_ = 0;
        older_01._0_12_ = *(undefined1 (*) [12])(*(long *)((long)N.ptr + 8) + 0x20);
        tVar4 = Curl_timediff_us(newer_01,older_01);
        if (0 < tVar4) {
          puVar2 = *(undefined8 **)((long)N.ptr + 8);
          *(undefined8 *)((long)N.ptr + 8) = *puVar2;
          *puVar2 = N.ptr;
          N.ptr = puVar2;
          if (puVar2[1] == 0) goto LAB_0018fa15;
        }
        r->larger = (Curl_tree *)N.ptr;
        r = (Curl_tree *)N.ptr;
        N.ptr = *(void **)((long)N.ptr + 8);
      }
      if (*N.ptr == 0) break;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar3._0_8_;
      newer_00.tv_usec = auVar3._8_4_;
      older_00._12_4_ = 0;
      older_00._0_12_ = *(undefined1 (*) [12])(*N.ptr + 0x20);
      tVar4 = Curl_timediff_us(newer_00,older_00);
      if (tVar4 < 0) {
        plVar1 = *N.ptr;
        *(long *)N.ptr = plVar1[1];
        plVar1[1] = (long)N.ptr;
        N.ptr = plVar1;
        if (*plVar1 == 0) break;
      }
      y->smaller = (Curl_tree *)N.ptr;
      y = (Curl_tree *)N.ptr;
      N.ptr = *N.ptr;
    }
LAB_0018fa15:
    r->larger = *N.ptr;
    y->smaller = *(Curl_tree **)((long)N.ptr + 8);
    *(Curl_tree **)N.ptr = N.smaller;
    *(Curl_tree **)((long)N.ptr + 8) = l;
    i_local._8_8_ = N.ptr;
  }
  return (Curl_tree *)i_local._8_8_;
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;

  if(!t)
    return NULL;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    timediff_t comp = compare(i, t->key);
    if(comp < 0) {
      if(!t->smaller)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(!t->smaller)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(!t->larger)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(!t->larger)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}